

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall c4::yml::Parser::_scan_block(Parser *this)

{
  csubstr *this_00;
  pfn_error p_Var1;
  ulong uVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  int iVar10;
  State *pSVar11;
  size_t sVar12;
  undefined8 uVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  BlockChomp_e chomp;
  ulong uVar17;
  size_t sVar18;
  char *pcVar19;
  char *pcVar20;
  ulong uVar21;
  BlockStyle_e BVar22;
  size_t sVar23;
  undefined8 uVar24;
  byte bVar25;
  basic_substring<const_char> bVar26;
  csubstr cVar27;
  ro_substr chars;
  ro_substr chars_00;
  ro_substr chars_01;
  csubstr fmt;
  csubstr buf;
  ro_substr chars_02;
  ro_substr pattern;
  ro_substr pattern_00;
  substr s;
  size_t indentation;
  size_t local_1c8;
  ulong local_1c0;
  undefined8 local_1b8;
  ulong local_1b0;
  csubstr local_1a8;
  LineContents lc;
  char msg [57];
  char *pcStack_e0;
  size_t local_d8;
  char *pcStack_b8;
  size_t local_b0;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  
  bVar25 = 0;
  local_1a8 = (this->m_state->line_contents).rem;
  bVar26 = basic_substring<const_char>::triml(&local_1a8,' ');
  sVar18 = (long)bVar26.str - (long)local_1a8.str;
  if (local_1a8.str <= bVar26.str && sVar18 != 0) {
    _line_progressed(this,sVar18);
    local_1a8 = bVar26;
  }
  if ((local_1a8.len == 0) || ((*local_1a8.str != '>' && (*local_1a8.str != '|')))) {
    builtin_strncpy(msg + 0x30,"th(\'>\'))",9);
    builtin_strncpy(msg + 0x20,") || s.begins_wi",0x10);
    builtin_strncpy(msg + 0x10,".begins_with(\'|\'",0x10);
    builtin_strncpy(msg,"check failed: (s",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      cVar27 = (csubstr)(*pcVar3)();
      return cVar27;
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar27 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_38 = cVar27.len;
    pcStack_40 = cVar27.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7ae2) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x7ae2) << 0x40,8);
    LVar4.name.str = pcStack_40;
    LVar4.name.len = local_38;
    (*p_Var1)(msg,0x39,LVar4,(this->m_stack).m_callbacks.m_user_data);
    if (local_1a8.len == 0) {
      indentation = 0xffffffffffffffff;
      sVar18 = 0;
      uVar24 = 0;
      uVar21 = 0;
      goto LAB_001cddab;
    }
  }
  uVar24 = CONCAT71(bVar26.str._1_7_,*local_1a8.str == '>');
  indentation = 0xffffffffffffffff;
  if (local_1a8.len == 1) {
    uVar21 = 0;
    sVar18 = 1;
  }
  else {
    chars.len = 2;
    chars.str = "|>";
    bVar9 = basic_substring<const_char>::begins_with_any(&local_1a8,chars);
    if (!bVar9) {
      builtin_strncpy(msg,"check failed: (s.begins_with_any(\"|>\"))",0x28);
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        cVar27 = (csubstr)(*pcVar3)();
        return cVar27;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar27 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_60 = cVar27.len;
      pcStack_68 = cVar27.str;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7aed) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x7aed) << 0x40,8);
      LVar5.name.str = pcStack_68;
      LVar5.name.len = local_60;
      (*p_Var1)(msg,0x28,LVar5,(this->m_stack).m_callbacks.m_user_data);
    }
    if (local_1a8.len == 0) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        cVar27 = (csubstr)(*pcVar3)();
        return cVar27;
      }
      handle_error(0x1e5106,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)msg,local_1a8.str + 1,local_1a8.len - 1);
    lc.full.len = CONCAT53(msg._11_5_,msg._8_3_);
    lc.full.str = (char *)msg._0_8_;
    if (lc.full.len == 0) {
      builtin_strncpy(msg + 0x10,".len >= 1)",0xb);
      builtin_strncpy(msg,"check failed: (t",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        cVar27 = (csubstr)(*pcVar3)();
        return cVar27;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar27 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_88 = cVar27.len;
      pcStack_90 = cVar27.str;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7af0) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x7af0) << 0x40,8);
      LVar6.name.str = pcStack_90;
      LVar6.name.len = local_88;
      (*p_Var1)(msg,0x1b,LVar6,(this->m_stack).m_callbacks.m_user_data);
    }
    uVar21 = 0;
    chars_00.len = 2;
    chars_00.str = "-+";
    sVar18 = basic_substring<const_char>::first_of(&lc.full,chars_00,0);
    if (sVar18 != 0xffffffffffffffff) {
      if (lc.full.len <= sVar18) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          cVar27 = (csubstr)(*pcVar3)();
          return cVar27;
        }
        handle_error(0x1e5106,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      uVar21 = 1;
      if (lc.full.str[sVar18] != '-') {
        uVar21 = (ulong)((uint)(lc.full.str[sVar18] == '+') * 2);
      }
      if (sVar18 == 0) {
        if (lc.full.len == 0) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            cVar27 = (csubstr)(*pcVar3)();
            return cVar27;
          }
          handle_error(0x1e5106,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)msg,lc.full.str + 1,lc.full.len - 1);
      }
      else {
        if (lc.full.len < sVar18) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            cVar27 = (csubstr)(*pcVar3)();
            return cVar27;
          }
          handle_error(0x1e5106,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x154e,"num <= len || num == npos");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)msg,lc.full.str,sVar18);
      }
      lc.full.len = CONCAT53(msg._11_5_,msg._8_3_);
      lc.full.str = (char *)msg._0_8_;
    }
    uVar13 = 0;
    chars_01.len = 10;
    chars_01.str = "0123456789";
    sVar18 = basic_substring<const_char>::first_not_of(&lc.full,chars_01,0);
    if ((sVar18 != 0xffffffffffffffff) && (lc.full.len < sVar18)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        cVar27 = (csubstr)(*pcVar3)();
        return cVar27;
      }
      handle_error(0x1e5106,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1569,"pos <= len || pos == npos");
    }
    if (sVar18 == 0xffffffffffffffff) {
      msg._0_8_ = lc.full.str;
      msg._8_3_ = (undefined3)lc.full.len;
      msg._11_5_ = (undefined5)(lc.full.len >> 0x18);
    }
    else {
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)msg,lc.full.str,sVar18);
    }
    pcVar14 = (char *)CONCAT53(msg._11_5_,msg._8_3_);
    if (msg._0_8_ != 0 && pcVar14 != (char *)0x0) {
      cVar27.len = (size_t)&indentation;
      cVar27.str = pcVar14;
      bVar9 = atou<unsigned_long>((c4 *)msg._0_8_,cVar27,
                                  (unsigned_long *)
                                  CONCAT71((int7)((ulong)uVar13 >> 8),
                                           msg._0_8_ == 0 || pcVar14 == (char *)0x0));
      if (!bVar9) {
        bVar9 = is_debugger_attached();
        if ((bVar9) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          cVar27 = (csubstr)(*pcVar3)();
          return cVar27;
        }
        fmt.len = 0x2a;
        fmt.str = "ERROR: parse error: could not read decimal";
        _err<>(this,fmt);
      }
      indentation = indentation + this->m_state->indref;
    }
    sVar18 = local_1a8.len;
  }
LAB_001cddab:
  _line_progressed(this,sVar18);
  _line_ended(this);
  _scan_line(this);
  pSVar11 = this->m_state;
  pcVar14 = (this->m_buf).str + (pSVar11->pos).super_LineCol.offset;
  if (pcVar14 != (pSVar11->line_contents).full.str) {
    pcVar19 = "check failed: (raw_block.begin() == m_state->line_contents.full.begin())";
    pcVar20 = msg;
    for (lVar15 = 0x49; lVar15 != 0; lVar15 = lVar15 + -1) {
      *pcVar20 = *pcVar19;
      pcVar19 = pcVar19 + (ulong)bVar25 * -2 + 1;
      pcVar20 = pcVar20 + (ulong)bVar25 * -2 + 1;
    }
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      cVar27 = (csubstr)(*pcVar3)();
      return cVar27;
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar27 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_b0 = cVar27.len;
    pcStack_b8 = cVar27.str;
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x7b12) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x7b12) << 0x40,8);
    LVar7.name.str = pcStack_b8;
    LVar7.name.len = local_b0;
    (*p_Var1)(msg,0x49,LVar7,(this->m_stack).m_callbacks.m_user_data);
    pSVar11 = this->m_state;
  }
  local_1c8 = (pSVar11->pos).super_LineCol.line;
  this_00 = &lc.rem;
  lc.rem.str = (char *)0x0;
  lc.rem.len = 0;
  lc.indentation = 0;
  lc.stripped.str = (char *)0x0;
  lc.stripped.len = 0;
  lc.full.str = (char *)0x0;
  lc.full.len = 0;
  uVar17 = 0xffffffffffffffff;
  lVar15 = 0;
  sVar18 = 0;
  local_1b0 = 0xffffffffffffffff;
  local_1c0 = uVar21;
  local_1b8 = uVar24;
  while( true ) {
    uVar21 = (pSVar11->pos).super_LineCol.offset;
    uVar2 = (this->m_buf).len;
    if (uVar2 <= uVar21) break;
    buf.len = uVar2;
    buf.str = (this->m_buf).str;
    LineContents::reset_with_next_line(&lc,buf,uVar21);
    if (indentation == 0xffffffffffffffff) {
      sVar12 = basic_substring<const_char>::first_not_of(&lc.stripped,' ',0);
      sVar23 = local_1c8;
      if (sVar12 == 0xffffffffffffffff) {
        if (uVar17 == 0xffffffffffffffff) {
          uVar17 = lc.indentation;
          if (lc.indentation == 0xffffffffffffffff) {
            uVar17 = lc.stripped.len;
          }
          if (uVar17 == 0) {
            uVar17 = (ulong)((this->m_state->flags & 0x88) != 0);
          }
        }
        else if (uVar17 < lc.stripped.len) {
          uVar17 = lc.stripped.len;
        }
      }
      else if (uVar17 == 0xffffffffffffffff) {
        uVar21 = this->m_state->indref;
        if (lc.indentation < uVar21) {
          BVar22 = (BlockStyle_e)local_1b8;
          chomp = (BlockChomp_e)local_1c0;
          if (sVar18 == 0) {
            _line_ended_undo(this);
            sVar18 = 0;
          }
          goto LAB_001ce0bd;
        }
        if ((lc.indentation == uVar21) && (uVar17 = local_1b0, (this->m_state->flags & 0xc) != 0))
        break;
        indentation = lc.indentation;
        uVar17 = 0xffffffffffffffff;
      }
      else {
        if (lc.indentation < uVar17) break;
        indentation = lc.indentation;
      }
    }
    else if (((lc.indentation < indentation) &&
             (chars_02.len = 4, chars_02.str = " \t\r\n",
             bVar26 = basic_substring<const_char>::trim(this_00,chars_02),
             bVar26.str != (char *)0x0 && bVar26.len != 0)) ||
            ((indentation == 0 &&
             ((((iVar10 = basic_substring<const_char>::compare(this_00,"...",3), iVar10 == 0 ||
                (pattern.len = 4, pattern.str = "... ",
                bVar9 = basic_substring<const_char>::begins_with(this_00,pattern), bVar9)) ||
               (iVar10 = basic_substring<const_char>::compare(this_00,"---",3), iVar10 == 0)) ||
              (pattern_00.len = 4, pattern_00.str = "--- ",
              bVar9 = basic_substring<const_char>::begins_with(this_00,pattern_00), bVar9))))))
    break;
    pSVar11 = this->m_state;
    (pSVar11->line_contents).indentation = lc.indentation;
    (pSVar11->line_contents).rem.str = lc.rem.str;
    (pSVar11->line_contents).rem.len = lc.rem.len;
    (pSVar11->line_contents).stripped.str = lc.stripped.str;
    (pSVar11->line_contents).stripped.len = lc.stripped.len;
    (pSVar11->line_contents).full.str = lc.full.str;
    (pSVar11->line_contents).full.len = lc.full.len;
    sVar18 = sVar18 + (this->m_state->line_contents).full.len;
    _line_progressed(this,(this->m_state->line_contents).rem.len);
    _line_ended(this);
    pSVar11 = this->m_state;
    lVar15 = lVar15 + -1;
  }
  local_1b0 = uVar17;
  BVar22 = (BlockStyle_e)local_1b8;
  chomp = (BlockChomp_e)local_1c0;
  sVar23 = local_1c8;
LAB_001ce0bd:
  if ((sVar23 - (this->m_state->pos).super_LineCol.line != lVar15) && (sVar18 != 0)) {
    pcVar19 = "check failed: (m_state->pos.line == (first + num_lines) || (raw_block.len == 0))";
    pcVar20 = msg;
    for (lVar16 = 0x51; lVar16 != 0; lVar16 = lVar16 + -1) {
      *pcVar20 = *pcVar19;
      pcVar19 = pcVar19 + (ulong)bVar25 * -2 + 1;
      pcVar20 = pcVar20 + (ulong)bVar25 * -2 + 1;
    }
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      cVar27 = (csubstr)(*pcVar3)();
      return cVar27;
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar27 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_d8 = cVar27.len;
    pcStack_e0 = cVar27.str;
    LVar8.super_LineCol.col = 0;
    LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7b87) << 0x40,0);
    LVar8.super_LineCol.line = SUB168(ZEXT816(0x7b87) << 0x40,8);
    LVar8.name.str = pcStack_e0;
    LVar8.name.len = local_d8;
    (*p_Var1)(msg,0x51,LVar8,(this->m_stack).m_callbacks.m_user_data);
  }
  if (indentation == 0xffffffffffffffff) {
    indentation = local_1b0;
  }
  if (lVar15 != 0) {
    _line_ended_undo(this);
  }
  s.len = sVar18;
  s.str = pcVar14;
  cVar27 = _filter_block_scalar(this,s,BVar22 & 0xff,chomp,indentation);
  return cVar27;
}

Assistant:

csubstr Parser::_scan_block()
{
    // nice explanation here: http://yaml-multiline.info/
    csubstr s = m_state->line_contents.rem;
    csubstr trimmed = s.triml(' ');
    if(trimmed.str > s.str)
    {
        _c4dbgp("skipping whitespace");
        _RYML_CB_ASSERT(m_stack.m_callbacks, trimmed.str >= s.str);
        _line_progressed(static_cast<size_t>(trimmed.str - s.str));
        s = trimmed;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.begins_with('|') || s.begins_with('>'));

    _c4dbgpf("scanning block: specs=\"{}\"", s);

    // parse the spec
    BlockStyle_e newline = s.begins_with('>') ? BLOCK_FOLD : BLOCK_LITERAL;
    BlockChomp_e chomp = CHOMP_CLIP; // default to clip unless + or - are used
    size_t indentation = npos; // have to find out if no spec is given
    csubstr digits;
    if(s.len > 1)
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.begins_with_any("|>"));
        csubstr t = s.sub(1);
        _c4dbgpf("scanning block: spec is multichar: '{}'", t);
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 1);
        size_t pos = t.first_of("-+");
        _c4dbgpf("scanning block: spec chomp char at {}", pos);
        if(pos != npos)
        {
            if(t[pos] == '-')
                chomp = CHOMP_STRIP;
            else if(t[pos] == '+')
                chomp = CHOMP_KEEP;
            if(pos == 0)
                t = t.sub(1);
            else
                t = t.first(pos);
        }
        // from here to the end, only digits are considered
        digits = t.left_of(t.first_not_of("0123456789"));
        if( ! digits.empty())
        {
            if( ! c4::atou(digits, &indentation))
                _c4err("parse error: could not read decimal");
            _c4dbgpf("scanning block: indentation specified: {}. add {} from curr state -> {}", indentation, m_state->indref, indentation+m_state->indref);
            indentation += m_state->indref;
        }
    }

    // finish the current line
    _line_progressed(s.len);
    _line_ended();
    _scan_line();

    _c4dbgpf("scanning block: style={}  chomp={}  indentation={}", newline==BLOCK_FOLD ? "fold" : "literal", chomp==CHOMP_CLIP ? "clip" : (chomp==CHOMP_STRIP ? "strip" : "keep"), indentation);

    // start with a zero-length block, already pointing at the right place
    substr raw_block(m_buf.data() + m_state->pos.offset, size_t(0));// m_state->line_contents.full.sub(0, 0);
    _RYML_CB_ASSERT(m_stack.m_callbacks, raw_block.begin() == m_state->line_contents.full.begin());

    // read every full line into a raw block,
    // from which newlines are to be stripped as needed.
    //
    // If no explicit indentation was given, pick it from the first
    // non-empty line. See
    // https://yaml.org/spec/1.2.2/#8111-block-indentation-indicator
    size_t num_lines = 0, first = m_state->pos.line, provisional_indentation = npos;
    LineContents lc;
    while(( ! _finished_file()))
    {
        // peek next line, but do not advance immediately
        lc.reset_with_next_line(m_buf, m_state->pos.offset);
        _c4dbgpf("scanning block: peeking at '{}'", lc.stripped);
        // evaluate termination conditions
        if(indentation != npos)
        {
            // stop when the line is deindented and not empty
            if(lc.indentation < indentation && ( ! lc.rem.trim(" \t\r\n").empty()))
            {
                _c4dbgpf("scanning block: indentation decreased ref={} thisline={}", indentation, lc.indentation);
                break;
            }
            else if(indentation == 0)
            {
                if((lc.rem == "..." || lc.rem.begins_with("... "))
                    ||
                   (lc.rem == "---" || lc.rem.begins_with("--- ")))
                {
                    _c4dbgp("scanning block: stop. indentation=0 and stream ended");
                    break;
                }
            }
        }
        else
        {
            _c4dbgpf("scanning block: indentation ref not set. firstnonws={}", lc.stripped.first_not_of(' '));
            if(lc.stripped.first_not_of(' ') != npos) // non-empty line
            {
                _c4dbgpf("scanning block: line not empty. indref={} indprov={} indentation={}", m_state->indref, provisional_indentation, lc.indentation);
                if(provisional_indentation == npos)
                {
                    if(lc.indentation < m_state->indref)
                    {
                        _c4dbgpf("scanning block: block terminated indentation={} < indref={}", lc.indentation, m_state->indref);
                        if(raw_block.len == 0)
                        {
                            _c4dbgp("scanning block: was empty, undo next line");
                            _line_ended_undo();
                        }
                        break;
                    }
                    else if(lc.indentation == m_state->indref)
                    {
                        if(has_any(RSEQ|RMAP))
                        {
                            _c4dbgpf("scanning block: block terminated. reading container and indentation={}==indref={}", lc.indentation, m_state->indref);
                            break;
                        }
                    }
                    _c4dbgpf("scanning block: set indentation ref from this line: ref={}", lc.indentation);
                    indentation = lc.indentation;
                }
                else
                {
                    if(lc.indentation >= provisional_indentation)
                    {
                        _c4dbgpf("scanning block: set indentation ref from provisional indentation: provisional_ref={}, thisline={}", provisional_indentation, lc.indentation);
                        //indentation = provisional_indentation ? provisional_indentation : lc.indentation;
                        indentation = lc.indentation;
                    }
                    else
                    {
                        break;
                        //_c4err("parse error: first non-empty block line should have at least the original indentation");
                    }
                }
            }
            else // empty line
            {
                _c4dbgpf("scanning block: line empty or {} spaces. line_indentation={} prov_indentation={}", lc.stripped.len, lc.indentation, provisional_indentation);
                if(provisional_indentation != npos)
                {
                    if(lc.stripped.len >= provisional_indentation)
                    {
                        _c4dbgpf("scanning block: increase provisional_ref {} -> {}", provisional_indentation, lc.stripped.len);
                        provisional_indentation = lc.stripped.len;
                    }
                    #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
                    else if(lc.indentation >= provisional_indentation && lc.indentation != npos)
                    {
                        _c4dbgpf("scanning block: increase provisional_ref {} -> {}", provisional_indentation, lc.indentation);
                        provisional_indentation = lc.indentation;
                    }
                    #endif
                }
                else
                {
                    provisional_indentation = lc.indentation ? lc.indentation : has_any(RSEQ|RVAL);
                    _c4dbgpf("scanning block: initialize provisional_ref={}", provisional_indentation);
                    if(provisional_indentation == npos)
                    {
                        provisional_indentation = lc.stripped.len ? lc.stripped.len : has_any(RSEQ|RVAL);
                        _c4dbgpf("scanning block: initialize provisional_ref={}", provisional_indentation);
                    }
                }
            }
        }
        // advance now that we know the folded scalar continues
        m_state->line_contents = lc;
        _c4dbgpf("scanning block: append '{}'", m_state->line_contents.rem);
        raw_block.len += m_state->line_contents.full.len;
        _line_progressed(m_state->line_contents.rem.len);
        _line_ended();
        ++num_lines;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.line == (first + num_lines) || (raw_block.len == 0));
    C4_UNUSED(num_lines);
    C4_UNUSED(first);

    if(indentation == npos)
    {
        _c4dbgpf("scanning block: set indentation from provisional: {}", provisional_indentation);
        indentation = provisional_indentation;
    }

    if(num_lines)
        _line_ended_undo();

    _c4dbgpf("scanning block: raw=~~~{}~~~", raw_block);

    // ok! now we strip the newlines and spaces according to the specs
    s = _filter_block_scalar(raw_block, newline, chomp, indentation);

    _c4dbgpf("scanning block: final=~~~{}~~~", s);

    return s;
}